

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O0

Fl_Widget * __thiscall Fl_Table_Type::enter_live_mode(Fl_Table_Type *this,int param_1)

{
  int x;
  int y;
  int w;
  int h;
  Fluid_Table *this_00;
  Fl_Group *grp;
  int param_1_local;
  Fl_Table_Type *this_local;
  
  this_00 = (Fluid_Table *)operator_new(0x330);
  x = Fl_Widget::x((this->super_Fl_Group_Type).super_Fl_Widget_Type.o);
  y = Fl_Widget::y((this->super_Fl_Group_Type).super_Fl_Widget_Type.o);
  w = Fl_Widget::w((this->super_Fl_Group_Type).super_Fl_Widget_Type.o);
  h = Fl_Widget::h((this->super_Fl_Group_Type).super_Fl_Widget_Type.o);
  Fluid_Table::Fluid_Table(this_00,x,y,w,h,(char *)0x0);
  (this->super_Fl_Group_Type).super_Fl_Widget_Type.live_widget = (Fl_Widget *)this_00;
  if ((this->super_Fl_Group_Type).super_Fl_Widget_Type.live_widget != (Fl_Widget *)0x0) {
    (*(this->super_Fl_Group_Type).super_Fl_Widget_Type.super_Fl_Type._vptr_Fl_Type[0x15])();
    Fl_Group::end((Fl_Group *)this_00);
  }
  return (this->super_Fl_Group_Type).super_Fl_Widget_Type.live_widget;
}

Assistant:

Fl_Widget *Fl_Table_Type::enter_live_mode(int) {
  Fl_Group *grp = new Fluid_Table(o->x(), o->y(), o->w(), o->h());
  live_widget = grp;
  if (live_widget) {
    copy_properties();
    grp->end();
  }
  return live_widget;
}